

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::RemoveUnusedInterfaceVariablesContext
          (RemoveUnusedInterfaceVariablesContext *this,RemoveUnusedInterfaceVariablesPass *parent,
          Instruction *entry)

{
  RemoveUnusedInterfaceVariablesContext *local_50;
  code *local_48;
  undefined8 local_40;
  type local_38;
  Instruction *local_20;
  Instruction *entry_local;
  RemoveUnusedInterfaceVariablesPass *parent_local;
  RemoveUnusedInterfaceVariablesContext *this_local;
  
  this->parent_ = parent;
  this->entry_ = entry;
  local_20 = entry;
  entry_local = (Instruction *)parent;
  parent_local = (RemoveUnusedInterfaceVariablesPass *)this;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->used_variables_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->operands_to_add_);
  local_48 = processFunction;
  local_40 = 0;
  local_50 = this;
  std::
  bind<bool(spvtools::opt::RemoveUnusedInterfaceVariablesContext::*)(spvtools::opt::Function*),spvtools::opt::RemoveUnusedInterfaceVariablesContext*,std::_Placeholder<1>const&>
            (&local_38,(offset_in_RemoveUnusedInterfaceVariablesContext_to_subr *)&local_48,
             &local_50,(_Placeholder<1> *)&std::placeholders::_1);
  std::function<bool(spvtools::opt::Function*)>::
  function<std::_Bind<bool(spvtools::opt::RemoveUnusedInterfaceVariablesContext::*(spvtools::opt::RemoveUnusedInterfaceVariablesContext*,std::_Placeholder<1>))(spvtools::opt::Function*)>,void>
            ((function<bool(spvtools::opt::Function*)> *)&this->pfn_,&local_38);
  return;
}

Assistant:

RemoveUnusedInterfaceVariablesContext(
      RemoveUnusedInterfaceVariablesPass& parent, Instruction& entry)
      : parent_(parent), entry_(entry) {}